

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aeskey.c
# Opt level: O1

int aes_decrypt_key192(uchar *key,aes_decrypt_ctx *cx)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  
  uVar26 = *(uint *)key;
  cx->ks[0x30] = uVar26;
  uVar23 = *(uint *)(key + 4);
  cx->ks[0x31] = uVar23;
  uVar19 = *(uint *)(key + 8);
  cx->ks[0x32] = uVar19;
  uVar9 = *(uint *)(key + 0xc);
  cx->ks[0x33] = uVar9;
  bVar1 = key[0x12];
  bVar2 = key[0x11];
  bVar3 = key[0x10];
  bVar4 = key[0x13];
  cx->ks[0x2c] = t_im[1][bVar2] ^ t_im[0][bVar3] ^ t_im[2][bVar1] ^ t_im[3][bVar4];
  bVar5 = key[0x17];
  bVar6 = key[0x16];
  bVar7 = key[0x15];
  bVar8 = key[0x14];
  cx->ks[0x2d] = t_im[1][bVar7] ^ t_im[0][bVar8] ^ t_im[2][bVar6] ^ t_im[3][bVar5];
  uVar26 = t_fl[0][bVar7] ^ t_fl[1][bVar6] ^ t_fl[2][bVar5] ^ t_fl[3][bVar8] ^ 1 ^ uVar26;
  uVar13 = t_im[1][uVar26 >> 8 & 0xff] ^ t_im[0][uVar26 & 0xff] ^
           *(uint *)((long)t_im[2] + (ulong)(uVar26 >> 0xe & 0x3fc)) ^ t_im[3][uVar26 >> 0x18];
  cx->ks[0x2e] = uVar13;
  uVar18 = uVar26 ^ uVar23;
  uVar11 = t_im[1][uVar18 >> 8 & 0xff] ^ t_im[0][uVar18 & 0xff] ^
           *(uint *)((long)t_im[2] + (ulong)(uVar18 >> 0xe & 0x3fc)) ^ t_im[3][uVar18 >> 0x18];
  uVar15 = (uint)bVar6 << 0x10 | (uint)bVar5 << 0x18 | (uint)bVar8 | (uint)bVar7 << 8;
  cx->ks[0x2f] = uVar11;
  uVar18 = uVar18 ^ uVar19;
  uVar16 = t_im[1][uVar18 >> 8 & 0xff] ^ t_im[0][uVar18 & 0xff] ^
           *(uint *)((long)t_im[2] + (ulong)(uVar18 >> 0xe & 0x3fc)) ^ t_im[3][uVar18 >> 0x18];
  cx->ks[0x28] = uVar16;
  uVar14 = uVar18 ^ uVar9;
  uVar12 = t_im[1][uVar14 >> 8 & 0xff] ^ t_im[0][uVar14 & 0xff] ^
           *(uint *)((long)t_im[2] + (ulong)(uVar14 >> 0xe & 0x3fc)) ^ t_im[3][uVar14 >> 0x18];
  uVar14 = uVar14 ^ ((uint)bVar1 << 0x10 | (uint)bVar4 << 0x18 | (uint)bVar3 | (uint)bVar2 << 8);
  cx->ks[0x29] = uVar12;
  uVar10 = t_im[1][uVar14 >> 8 & 0xff] ^ t_im[0][uVar14 & 0xff] ^
           *(uint *)((long)t_im[2] + (ulong)(uVar14 >> 0xe & 0x3fc)) ^ t_im[3][uVar14 >> 0x18];
  cx->ks[0x2a] = uVar10;
  uVar19 = uVar14 ^ uVar15;
  uVar17 = (ulong)((uVar19 & 0xff) << 2);
  uVar22 = uVar19 >> 8 & 0xff;
  uVar24 = (ulong)(uVar19 >> 0xe & 0x3fc);
  uVar21 = t_im[1][uVar22] ^ *(uint *)((long)t_im[0] + uVar17) ^ *(uint *)((long)t_im[2] + uVar24) ^
           t_im[3][uVar19 >> 0x18];
  cx->ks[0x2b] = uVar21;
  uVar19 = *(uint *)((long)t_fl[1] + uVar24) ^ t_fl[0][uVar22] ^ t_fl[2][uVar19 >> 0x18] ^
           *(uint *)((long)t_fl[3] + uVar17);
  uVar22 = uVar19 ^ 2;
  uVar13 = t_im[0][uVar22 & 0xff] ^ t_im[1][uVar19 >> 8 & 0xff] ^
           *(uint *)((long)t_im[2] + (ulong)(uVar19 >> 0xe & 0x3fc)) ^ t_im[3][uVar19 >> 0x18] ^
           uVar13;
  cx->ks[0x24] = uVar13;
  cx->ks[0x25] = uVar13 ^ uVar11;
  uVar16 = uVar13 ^ uVar11 ^ uVar16;
  cx->ks[0x26] = uVar16;
  cx->ks[0x27] = uVar16 ^ uVar12;
  uVar10 = uVar16 ^ uVar12 ^ uVar10;
  cx->ks[0x20] = uVar10;
  cx->ks[0x21] = uVar10 ^ uVar21;
  uVar28 = uVar15 ^ uVar9 ^ uVar22 ^ uVar23;
  uVar19 = *(uint *)((long)t_fl[1] + (ulong)(uVar28 >> 0xe & 0x3fc)) ^ t_fl[0][uVar28 >> 8 & 0xff] ^
           t_fl[2][uVar28 >> 0x18] ^ t_fl[3][uVar28 & 0xff];
  uVar27 = uVar26 ^ uVar22 ^ uVar19 ^ 4;
  uVar15 = t_im[1][uVar19 >> 8 & 0xff] ^ t_im[0][(uVar19 ^ 4) & 0xff] ^
           *(uint *)((long)t_im[2] + (ulong)(uVar19 >> 0xe & 0x3fc)) ^ t_im[3][uVar19 >> 0x18];
  uVar13 = uVar13 ^ uVar15;
  uVar15 = uVar15 ^ uVar11;
  cx->ks[0x22] = uVar13;
  cx->ks[0x23] = uVar15;
  cx->ks[0x1c] = uVar15 ^ uVar16;
  uVar26 = uVar15 ^ uVar12;
  cx->ks[0x1d] = uVar26;
  cx->ks[0x1e] = uVar26 ^ uVar10;
  uVar18 = uVar18 ^ uVar27;
  uVar19 = uVar28 ^ uVar14 ^ uVar18;
  uVar21 = uVar21 ^ uVar26;
  cx->ks[0x1f] = uVar21;
  uVar19 = *(uint *)((long)t_fl[1] + (ulong)(uVar19 >> 0xe & 0x3fc)) ^ t_fl[0][uVar19 >> 8 & 0xff] ^
           t_fl[2][uVar19 >> 0x18] ^ t_fl[3][uVar19 & 0xff];
  uVar20 = uVar19 ^ 8;
  uVar13 = t_im[0][uVar20 & 0xff] ^ t_im[1][uVar19 >> 8 & 0xff] ^
           *(uint *)((long)t_im[2] + (ulong)(uVar19 >> 0xe & 0x3fc)) ^ t_im[3][uVar19 >> 0x18] ^
           uVar13;
  cx->ks[0x18] = uVar13;
  cx->ks[0x19] = uVar13 ^ uVar15;
  uVar16 = uVar16 ^ uVar13;
  cx->ks[0x1a] = uVar16;
  cx->ks[0x1b] = uVar26 ^ uVar16;
  uVar25 = uVar16 ^ uVar10;
  cx->ks[0x14] = uVar25;
  cx->ks[0x15] = uVar25 ^ uVar21;
  uVar19 = uVar20 ^ uVar9 ^ uVar28;
  uVar26 = *(uint *)((long)t_fl[1] + (ulong)(uVar19 >> 0xe & 0x3fc)) ^ t_fl[0][uVar19 >> 8 & 0xff] ^
           t_fl[2][uVar19 >> 0x18] ^ t_fl[3][uVar19 & 0xff];
  uVar27 = uVar27 ^ uVar20 ^ uVar26 ^ 0x10;
  uVar11 = t_im[1][uVar26 >> 8 & 0xff] ^ t_im[0][(uVar26 ^ 0x10) & 0xff] ^
           *(uint *)((long)t_im[2] + (ulong)(uVar26 >> 0xe & 0x3fc)) ^ t_im[3][uVar26 >> 0x18];
  cx->ks[0x16] = uVar13 ^ uVar11;
  uVar15 = uVar15 ^ uVar11;
  cx->ks[0x17] = uVar15;
  cx->ks[0x10] = uVar15 ^ uVar16;
  uVar12 = uVar11 ^ uVar12;
  cx->ks[0x11] = uVar12;
  cx->ks[0x12] = uVar25 ^ uVar12;
  uVar19 = uVar19 ^ uVar14 ^ uVar27;
  cx->ks[0x13] = uVar12 ^ uVar21;
  uVar26 = *(uint *)((long)t_fl[1] + (ulong)(uVar19 >> 0xe & 0x3fc)) ^ t_fl[0][uVar19 >> 8 & 0xff] ^
           t_fl[2][uVar19 >> 0x18] ^ t_fl[3][uVar19 & 0xff];
  uVar19 = uVar26 ^ 0x20;
  uVar22 = uVar22 ^ uVar23 ^ uVar20 ^ uVar19;
  uVar23 = t_im[0][uVar19 & 0xff] ^ t_im[1][uVar26 >> 8 & 0xff] ^
           *(uint *)((long)t_im[2] + (ulong)(uVar26 >> 0xe & 0x3fc)) ^ t_im[3][uVar26 >> 0x18] ^
           uVar13 ^ uVar11;
  cx->ks[0xc] = uVar23;
  cx->ks[0xd] = uVar23 ^ uVar15;
  uVar16 = uVar16 ^ uVar23;
  cx->ks[0xe] = uVar16;
  cx->ks[0xf] = uVar16 ^ uVar12;
  uVar10 = uVar10 ^ uVar23;
  cx->ks[8] = uVar10;
  cx->ks[9] = uVar12 ^ uVar21 ^ uVar10;
  uVar28 = uVar28 ^ uVar22;
  uVar26 = *(uint *)((long)t_fl[1] + (ulong)(uVar28 >> 0xe & 0x3fc)) ^ t_fl[0][uVar28 >> 8 & 0xff] ^
           t_fl[2][uVar28 >> 0x18] ^ t_fl[3][uVar28 & 0xff];
  uVar19 = uVar27 ^ uVar19 ^ uVar26 ^ 0x40;
  uVar26 = t_im[1][uVar26 >> 8 & 0xff] ^ t_im[0][(uVar26 ^ 0x40) & 0xff] ^
           *(uint *)((long)t_im[2] + (ulong)(uVar26 >> 0xe & 0x3fc)) ^ t_im[3][uVar26 >> 0x18];
  cx->ks[10] = uVar23 ^ uVar26;
  uVar26 = uVar26 ^ uVar15;
  cx->ks[0xb] = uVar26;
  cx->ks[4] = uVar16 ^ uVar26;
  cx->ks[5] = uVar12 ^ uVar26;
  cx->ks[6] = uVar12 ^ uVar26 ^ uVar10;
  uVar23 = uVar18 ^ uVar27 ^ uVar19;
  uVar10 = uVar28 ^ uVar14 ^ uVar27 ^ uVar23;
  cx->ks[7] = uVar26 ^ uVar21;
  uVar26 = *(uint *)((long)t_fl[1] + (ulong)(uVar10 >> 0xe & 0x3fc)) ^ t_fl[0][uVar10 >> 8 & 0xff] ^
           t_fl[2][uVar10 >> 0x18] ^ t_fl[3][uVar10 & 0xff] ^ 0x80;
  cx->ks[0] = uVar19 ^ uVar26;
  uVar22 = uVar22 ^ uVar26;
  cx->ks[1] = uVar22;
  cx->ks[2] = uVar22 ^ uVar23;
  cx->ks[3] = uVar26 ^ uVar20 ^ uVar9;
  (cx->inf).l = 0;
  (cx->inf).b[0] = 0xc0;
  return 0;
}

Assistant:

AES_RETURN aes_xi(decrypt_key192)(const unsigned char *key, aes_decrypt_ctx cx[1])
{   uint32_t    ss[7];
#if defined( d_vars )
        d_vars;
#endif

    cx->ks[v(48,(0))] = ss[0] = word_in(key, 0);
    cx->ks[v(48,(1))] = ss[1] = word_in(key, 1);
    cx->ks[v(48,(2))] = ss[2] = word_in(key, 2);
    cx->ks[v(48,(3))] = ss[3] = word_in(key, 3);

#ifdef DEC_KS_UNROLL
    cx->ks[v(48,(4))] = ff(ss[4] = word_in(key, 4));
    cx->ks[v(48,(5))] = ff(ss[5] = word_in(key, 5));
    kdf6(cx->ks, 0); kd6(cx->ks, 1);
    kd6(cx->ks, 2);  kd6(cx->ks, 3);
    kd6(cx->ks, 4);  kd6(cx->ks, 5);
    kd6(cx->ks, 6);  kdl6(cx->ks, 7);
#else
    cx->ks[v(48,(4))] = ss[4] = word_in(key, 4);
    cx->ks[v(48,(5))] = ss[5] = word_in(key, 5);
    {   uint32_t i;

        for(i = 0; i < 7; ++i)
            k6e(cx->ks, i);
        k6ef(cx->ks, 7);
#if !(DEC_ROUND == NO_TABLES)
        for(i = N_COLS; i < 12 * N_COLS; ++i)
            cx->ks[i] = inv_mcol(cx->ks[i]);
#endif
    }
#endif
    cx->inf.l = 0;
    cx->inf.b[0] = 12 * 16;

#ifdef USE_VIA_ACE_IF_PRESENT
    if(VIA_ACE_AVAILABLE)
        cx->inf.b[1] = 0xff;
#endif
    return EXIT_SUCCESS;
}